

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L;
  StkId pTVar1;
  TValue *io;
  TString *pTVar2;
  TValue *pTVar3;
  TString *x_;
  
  L = ls->L;
  pTVar2 = luaS_newlstr(L,str,l);
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  (pTVar1->value_).gc = (GCObject *)pTVar2;
  pTVar1->tt_ = pTVar2->tt | 0x40;
  pTVar3 = luaH_set(L,ls->h,L->top + -1);
  if (pTVar3->tt_ == 0) {
    (pTVar3->value_).b = 1;
    pTVar3->tt_ = 1;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
  }
  else {
    pTVar2 = (TString *)pTVar3[1].value_.gc;
  }
  L->top = L->top + -1;
  return pTVar2;
}

Assistant:

TString *luaX_newstring (LexState *ls, const char *str, size_t l) {
  lua_State *L = ls->L;
  TValue *o;  /* entry for 'str' */
  TString *ts = luaS_newlstr(L, str, l);  /* create new string */
  setsvalue2s(L, L->top++, ts);  /* temporarily anchor it in stack */
  o = luaH_set(L, ls->h, L->top - 1);
  if (ttisnil(o)) {  /* not in use yet? */
    /* boolean value does not need GC barrier;
       table has no metatable, so it does not need to invalidate cache */
    setbvalue(o, 1);  /* t[string] = true */
    luaC_checkGC(L);
  }
  else {  /* string already present */
    ts = tsvalue(keyfromval(o));  /* re-use value previously stored */
  }
  L->top--;  /* remove string from stack */
  return ts;
}